

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O1

bool cmBlockCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  pointer __s1;
  cmMakefile *m;
  bool bVar1;
  int iVar2;
  long lVar3;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> tVar4;
  PolicyPushPop *this;
  VariablePushPop *this_00;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RCX;
  ulong uVar5;
  pointer *__ptr;
  pointer __p;
  pointer pbVar6;
  size_type __rlen;
  ulong uVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  static_string_view name;
  static_string_view name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_188;
  __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
  *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [24];
  _Any_data _Stack_140;
  _Manager_type p_Stack_130;
  _Invoker_type local_128;
  undefined1 auStack_120 [24];
  _Manager_type local_108;
  pointer ppStack_100;
  pointer local_f8;
  pointer ppStack_f0;
  undefined1 local_e8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  char local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false> local_60;
  _Manager_type local_58;
  undefined1 local_50 [32];
  
  if ((cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar2 != 0)) {
    local_f8 = (pointer)0x0;
    ppStack_f0 = (pointer)0x0;
    local_108 = (_Manager_type)0x0;
    ppStack_100 = (pointer)0x0;
    auStack_120._8_8_ = 0;
    auStack_120._16_8_ = 0;
    local_128 = (_Invoker_type)0x0;
    auStack_120._0_8_ = (void *)0x0;
    _Stack_140._8_8_ = 0;
    p_Stack_130 = (_Manager_type)0x0;
    local_158._16_8_ = (pointer)0x0;
    _Stack_140._M_unused._M_object = (void *)0x0;
    local_158._0_8_ = (ActionMap *)0x0;
    local_158._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "SCOPE_FOR";
    name.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_158,name,in_RCX);
    name_00.super_string_view._M_str = "PROPAGATE";
    name_00.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_158,name_00,in_RCX);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&cmBlockCommand::parser,(ActionMap *)local_158);
    ArgumentParser::Base::~Base((Base *)local_158);
    __cxa_atexit(ArgumentParser::Base::~Base,&cmBlockCommand::parser,&__dso_handle);
    __cxa_guard_release(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_158._16_8_ = local_e8;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_c8.second.super__Function_base._M_functor._8_8_ = &local_c8.first._M_str;
  local_c8.first._M_str._0_4_ = 0;
  local_c8.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c8.second._M_invoker = (_Invoker_type)0x0;
  local_80 = '\0';
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._0_8_ = &cmBlockCommand::parser;
  local_158._8_8_ = &local_c8;
  _Stack_140._8_8_ = 0;
  p_Stack_130 = (_Manager_type)0x0;
  local_128 = (_Invoker_type)0x0;
  auStack_120._0_8_ = (void *)0x0;
  auStack_120._8_8_ = 0;
  auStack_120._16_8_ = 0;
  local_108 = (_Manager_type)0x0;
  ppStack_100 = (pointer)0x0;
  local_f8 = (pointer)((ulong)local_f8 & 0xffffffffffffff00);
  _Stack_140._M_unused._0_8_ = (undefined8)local_158._8_8_;
  local_c8.second.super__Function_base._M_manager =
       (_Manager_type)local_c8.second.super__Function_base._M_functor._8_8_;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)local_158,args,0);
  if (local_108 != (_Manager_type)0x0) {
    (*local_108)((_Any_data *)(auStack_120 + 8),(_Any_data *)(auStack_120 + 8),__destroy_functor);
  }
  if (local_e8._0_8_ == local_e8._8_8_) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)&local_c8,status->Makefile)
    ;
    if (bVar1) {
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else {
      if (local_80 == '\x01') {
        uVar7 = 0;
        for (pbVar6 = local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar6 != local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
          __s1 = (pbVar6->_M_dataplus)._M_p;
          if (pbVar6->_M_string_length == 8) {
            iVar2 = bcmp(__s1,"POLICIES",8);
            uVar5 = 2;
            if (iVar2 != 0) {
LAB_001fae94:
              _Stack_140._M_unused._M_object = (pbVar6->_M_dataplus)._M_p;
              local_158._16_8_ = pbVar6->_M_string_length;
              local_158._0_8_ = (ActionMap *)0x1d;
              local_158._8_8_ = "SCOPE_FOR unsupported scope \"";
              p_Stack_130 = (_Manager_type)local_50;
              local_60._M_head_impl = (PolicyPushPop *)0x1;
              local_50[0] = '\"';
              _Stack_140._8_8_ = 1;
              views_00._M_len = 3;
              views_00._M_array = (iterator)local_158;
              local_58 = p_Stack_130;
              cmCatViews_abi_cxx11_((string *)local_178,views_00);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_001fab46;
            }
          }
          else {
            if ((pbVar6->_M_string_length != 9) || (iVar2 = bcmp(__s1,"VARIABLES",9), iVar2 != 0))
            goto LAB_001fae94;
            uVar5 = 1;
          }
          uVar7 = uVar7 | uVar5;
        }
      }
      else {
        local_158._0_2_ = 0x100;
        lVar3 = 0;
        uVar7 = 0;
        do {
          uVar5 = (ulong)(byte)local_158[lVar3];
          if (7 < uVar5) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,8);
          }
          uVar7 = uVar7 | 1L << (uVar5 & 0x3f);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 2);
      }
      if (((uVar7 & 1) == 0) &&
         (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        local_158._0_8_ = (ActionMap *)(local_158 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,
                   "PROPAGATE cannot be specified without a new scope for VARIABLES","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        local_178._16_8_ = local_158._16_8_;
        local_178._0_8_ = local_158._0_8_;
        if ((ActionMap *)local_158._0_8_ != (ActionMap *)(local_158 + 0x10)) goto LAB_001fab59;
        goto LAB_001fab61;
      }
      m = status->Makefile;
      tVar4.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           operator_new(0xd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_158,&local_78);
      *(long **)((long)tVar4.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
           (long *)((long)tVar4.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined1 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
      *(long **)((long)tVar4.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
           (long *)((long)tVar4.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined1 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
      *(undefined1 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
      *(undefined4 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
      *(undefined ***)
       tVar4.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
       super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           &PTR__cmBlockFunctionBlocker_0085af88;
      *(cmMakefile **)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = m;
      *(ulong *)((long)tVar4.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) =
           uVar7;
      local_180 = (__uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                   *)((long)tVar4.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8);
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
      *(long *)((long)tVar4.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0) = 0;
      if ((uVar7 & 2) != 0) {
        this = (PolicyPushPop *)operator_new(8);
        cmMakefile::PolicyPushPop::PolicyPushPop(this,m);
        local_60._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::reset(local_180,this);
        std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::~unique_ptr((unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                       *)&local_60);
      }
      if ((uVar7 & 1) != 0) {
        this_00 = (VariablePushPop *)operator_new(8);
        cmMakefile::VariablePushPop::VariablePushPop(this_00,m);
        local_60._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
        ::reset((__uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                 *)((long)tVar4.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0),
                this_00);
        std::
        unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
        ~unique_ptr((unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                     *)&local_60);
      }
      *(undefined8 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) =
           local_158._0_8_;
      *(undefined8 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0) =
           local_158._8_8_;
      *(undefined8 *)
       ((long)tVar4.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 200) =
           local_158._16_8_;
      local_158._0_8_ = (ActionMap *)0x0;
      local_158._8_8_ =
           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
            *)0x0;
      local_158._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158);
      local_188._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           tVar4.
           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
           super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                 &local_188);
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_188._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_188._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
      }
      local_188._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    }
    bVar1 = true;
  }
  else {
    _Stack_140._M_unused._M_object = ((_Alloc_hider *)local_e8._0_8_)->_M_p;
    local_158._16_8_ = *(size_type *)(local_e8._0_8_ + 8);
    local_158._0_8_ = (ActionMap *)0x22;
    local_158._8_8_ = "called with unsupported argument \"";
    p_Stack_130 = (_Manager_type)local_50;
    local_60._M_head_impl = (PolicyPushPop *)0x1;
    local_50[0] = '\"';
    _Stack_140._8_8_ = 1;
    views._M_len = 3;
    views._M_array = (iterator)local_158;
    local_58 = p_Stack_130;
    cmCatViews_abi_cxx11_((string *)local_178,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001fab46:
    if ((ActionMap *)local_178._0_8_ != (ActionMap *)(local_178 + 0x10)) {
LAB_001fab59:
      operator_delete((void *)local_178._0_8_,
                      (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&((pointer)local_178._16_8_)->first)->_M_impl).
                                     super__Vector_impl_data._M_start + 1));
    }
LAB_001fab61:
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_80 == '\x01') {
    local_80 = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  return bVar1;
}

Assistant:

bool cmBlockCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>> ScopeFor;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Propagate;
  };
  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("SCOPE_FOR"_s, &Arguments::ScopeFor)
                               .Bind("PROPAGATE"_s, &Arguments::Propagate);
  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs = parser.Parse(args, &unrecognizedArguments);

  if (!unrecognizedArguments.empty()) {
    status.SetError(cmStrCat("called with unsupported argument \"",
                             unrecognizedArguments[0], '"'));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  ScopeSet scopes;

  if (parsedArgs.ScopeFor) {
    for (auto const& scope : *parsedArgs.ScopeFor) {
      if (scope == "VARIABLES"_s) {
        scopes.insert(ScopeType::VARIABLES);
        continue;
      }
      if (scope == "POLICIES"_s) {
        scopes.insert(ScopeType::POLICIES);
        continue;
      }
      status.SetError(cmStrCat("SCOPE_FOR unsupported scope \"", scope, '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    scopes = { ScopeType::VARIABLES, ScopeType::POLICIES };
  }
  if (!scopes.contains(ScopeType::VARIABLES) &&
      !parsedArgs.Propagate.empty()) {
    status.SetError(
      "PROPAGATE cannot be specified without a new scope for VARIABLES");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmBlockFunctionBlocker>(
    &status.GetMakefile(), scopes, parsedArgs.Propagate);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}